

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::BuildElementCP
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot instance,RegSlot regSlot,
          CacheId inlineCacheIndex)

{
  PropertySym *propertySym;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  PropertyId propertyId;
  int iVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *pJVar7;
  SymOpnd *this_00;
  undefined4 extraout_var;
  AddrOpnd *this_01;
  undefined4 extraout_var_00;
  JitProfilingInstr *instr;
  JITTimeProfileInfo *this_02;
  FldInfo *pFVar8;
  PropertySymOpnd *pPVar9;
  RegOpnd *dstOpnd;
  char *this_03;
  BuiltinFunction local_34;
  bool local_33;
  OpCode local_32 [3];
  BuiltinFunction builtInIndex;
  bool isLdFldThatWasNotProfiled;
  OpCode newOpcode_local;
  
  local_32[0] = newOpcode;
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1233,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_004d1d9a;
    *puVar6 = 0;
  }
  bVar2 = OpCodeAttr::IsProfiledOp(newOpcode);
  if (bVar2) {
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(local_32);
  }
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  propertyId = JITTimeFunctionBody::GetPropertyIdFromCacheId(pJVar7,inlineCacheIndex);
  bVar3 = false;
  this_00 = BuildFieldOpnd(this,local_32[0],instance,propertyId,0xffffffff,PropertyKindData,
                           inlineCacheIndex);
  local_33 = false;
  if (ScopedLdFld < local_32[0]) {
    if (local_32[0] < InitUndeclConstFld) {
      if (local_32[0] == ScopedLdMethodFld) goto switchD_004d1999_caseD_68;
      bVar4 = false;
      if (local_32[0] == LdLen_A) goto switchD_004d1999_caseD_5e;
    }
    else {
      if (local_32[0] == InitUndeclConstFld) goto switchD_004d1999_caseD_53;
      if (local_32[0] == LdRootFldForTypeOf) goto switchD_004d1999_caseD_68;
    }
switchD_004d1999_caseD_58:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x12b1,"((0))","Unknown ElementCP opcode");
    if (bVar2) {
      *puVar6 = 0;
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    goto LAB_004d1d9a;
  }
  bVar4 = false;
  switch(local_32[0]) {
  case InitLetFld:
  case InitRootLetFld:
  case InitConstFld:
  case InitRootConstFld:
  case InitClassMember:
  case StRootFld:
  case StFldStrict:
  case StRootFldStrict:
  case InitFld:
  case InitRootFld:
    break;
  case ArgIn0:
  case ArgOut_A:
  case ProfiledArgOut_A:
  case ArgOut_ANonVar:
  case ArgOut_Env:
  case Delete_A:
  case ProfiledLdFld:
  case ProfiledLdFld_ReuseLoc:
  case LdLocalFld:
  case ProfiledLdLocalFld:
  case LdLocalFld_ReuseLoc:
  case ProfiledLdLocalFld_ReuseLoc:
  case ProfiledLdFldForTypeOf:
  case ProfiledLdFldForCallApplyTarget:
  case ProfiledLdRootFld:
  case ProfiledLdMethodFld:
  case ProfiledLdRootMethodFld:
  case ProfiledStFld:
  case ProfiledStRootFld:
  case StLocalFld:
  case ProfiledStLocalFld:
  case ProfiledStFldStrict:
  case ProfiledStRootFldStrict:
  case ProfiledInitFld:
  case InitLocalFld:
  case ProfiledInitLocalFld:
    goto switchD_004d1999_caseD_58;
  case LdFld:
  case LdFldForTypeOf:
    goto switchD_004d1999_caseD_5e;
  case LdFld_ReuseLoc:
    local_32[0] = LdFld;
    bVar4 = true;
switchD_004d1999_caseD_5e:
    bVar3 = bVar4;
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (((bVar4) &&
        (pPVar9 = IR::Opnd::AsPropertySymOpnd(&this_00->super_Opnd),
        pPVar9->m_runtimePolymorphicInlineCache != (JITTimePolymorphicInlineCache *)0x0)) &&
       (-1 < (char)pPVar9->m_polyCacheUtil)) {
      pPVar9->m_runtimePolymorphicInlineCache = (JITTimePolymorphicInlineCache *)0x0;
    }
switchD_004d1999_caseD_68:
    dstOpnd = BuildDstOpnd(this,regSlot,TyVar,false,bVar3);
    if ((!bVar2) ||
       (this_03 = &this->seenLdStackArgPtr,
       instr = (JitProfilingInstr *)
               BuildProfiledFieldLoad(this,local_32[0],dstOpnd,this_00,inlineCacheIndex,&local_33),
       instr == (JitProfilingInstr *)0x0)) {
      this_03 = (char *)(ulong)local_32[0];
      instr = (JitProfilingInstr *)
              IR::Instr::New(local_32[0],&dstOpnd->super_Opnd,&this_00->super_Opnd,this->m_func);
    }
    if ((local_32[0] - 0x5e < 0x28) &&
       ((0x8000014401U >> ((ulong)(local_32[0] - 0x5e) & 0x3f) & 1) != 0)) {
      local_34._value = 'H';
      propertySym = (PropertySym *)this_00->m_sym;
      if ((propertySym->super_Sym).m_kind != SymKindProperty) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        this_03 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
        ;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
        if (!bVar2) goto LAB_004d1d9a;
        *puVar6 = 0;
      }
      CheckBuiltIn((IRBuilder *)this_03,propertySym,&local_34);
      (dstOpnd->m_sym->m_builtInIndex)._value = local_34._value;
    }
    goto LAB_004d1d60;
  case LdFldForCallApplyTarget:
  case LdRootFld:
  case LdMethodFld:
  case LdRootMethodFld:
    goto switchD_004d1999_caseD_68;
  case StFld:
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (((bVar3) &&
        (pPVar9 = IR::Opnd::AsPropertySymOpnd(&this_00->super_Opnd),
        pPVar9->m_runtimePolymorphicInlineCache != (JITTimePolymorphicInlineCache *)0x0)) &&
       (-1 < (char)pPVar9->m_polyCacheUtil)) {
      pPVar9->m_runtimePolymorphicInlineCache = (JITTimePolymorphicInlineCache *)0x0;
    }
    break;
  default:
    if (local_32[0] != InitUndeclLetFld) goto switchD_004d1999_caseD_58;
  }
switchD_004d1999_caseD_53:
  if (local_32[0] == InitUndeclConstFld) {
    iVar5 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[4])();
    this_01 = IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar5),AddrOpndKindDynamicVar,this->m_func,
                                true,(Var)0x0);
    IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)0x2000);
    local_32[0] = InitConstFld;
  }
  else if (local_32[0] == InitUndeclLetFld) {
    iVar5 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[4])();
    this_01 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar5),AddrOpndKindDynamicVar,this->m_func,
                                true,(Var)0x0);
    IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)0x2000);
    local_32[0] = InitLetFld;
  }
  else {
    this_01 = (AddrOpnd *)BuildSrcOpnd(this,regSlot,TyVar);
  }
  if (bVar2) {
    bVar2 = Func::DoSimpleJitDynamicProfile(this->m_func);
    if (bVar2) {
      instr = IR::JitProfilingInstr::New
                        (local_32[0],&this_00->super_Opnd,&this_01->super_Opnd,this->m_func);
      if (instr != (JitProfilingInstr *)0x0) goto LAB_004d1d60;
    }
    else {
      pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      bVar2 = JITTimeFunctionBody::HasProfileInfo(pJVar7);
      if (bVar2) {
        instr = (JitProfilingInstr *)
                IR::ProfiledInstr::New
                          (local_32[0],&this_00->super_Opnd,&this_01->super_Opnd,this->m_func);
        pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        this_02 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar7);
        pFVar8 = JITTimeProfileInfo::GetFldInfo(this_02,inlineCacheIndex);
        if ((instr->super_Instr).m_kind != InstrKindProfiled) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
          if (!bVar2) {
LAB_004d1d9a:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
        *(FldInfo *)&instr->profileId = *pFVar8;
        goto LAB_004d1d60;
      }
    }
  }
  instr = (JitProfilingInstr *)
          IR::Instr::New(local_32[0],&this_00->super_Opnd,&this_01->super_Opnd,this->m_func);
LAB_004d1d60:
  AddInstr(this,&instr->super_Instr,offset);
  if ((local_33 == true) && (bVar2 = DoBailOnNoProfile(this), bVar2)) {
    InsertBailOnNoProfile(this,&instr->super_Instr);
  }
  return;
}

Assistant:

void
IRBuilder::BuildElementCP(Js::OpCode newOpcode, uint32 offset, Js::RegSlot instance, Js::RegSlot regSlot, Js::CacheId inlineCacheIndex)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    Js::PropertyId  propertyId;
    bool isProfiled = OpCodeAttr::IsProfiledOp(newOpcode);

    if (isProfiled)
    {
        Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);
    }

    propertyId = m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(inlineCacheIndex);

    IR::SymOpnd *   fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, (Js::PropertyIdIndexType)-1, PropertyKindData, inlineCacheIndex);
    IR::RegOpnd *   regOpnd;

    IR::Instr *     instr = nullptr;
    bool isLdFldThatWasNotProfiled = false;
    bool reuseLoc = false;
    switch (newOpcode)
    {
    case Js::OpCode::LdFld_ReuseLoc:
        reuseLoc = true;
        newOpcode = Js::OpCode::LdFld;
        // fall through
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdFld:
    case Js::OpCode::LdLen_A:
        if (fieldSymOpnd->IsPropertySymOpnd())
        {
            fieldSymOpnd->AsPropertySymOpnd()->TryDisableRuntimePolymorphicCache();
        }
    case Js::OpCode::LdFldForCallApplyTarget:
    case Js::OpCode::LdRootFldForTypeOf:
    case Js::OpCode::LdRootFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdRootMethodFld:
    case Js::OpCode::ScopedLdMethodFld:
        // Load
        // LdMethodFromFlags is backend only. Don't need to be added here.
        regOpnd = this->BuildDstOpnd(regSlot, TyVar, false, reuseLoc);

        if (isProfiled)
        {
            instr = this->BuildProfiledFieldLoad(newOpcode, regOpnd, fieldSymOpnd, inlineCacheIndex, &isLdFldThatWasNotProfiled);
        }

        // If it hasn't been set yet
        if (!instr)
        {
            instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
        }

        if (newOpcode == Js::OpCode::LdFld ||
            newOpcode == Js::OpCode::LdFldForCallApplyTarget ||
            newOpcode == Js::OpCode::LdMethodFld ||
            newOpcode == Js::OpCode::LdRootMethodFld ||
            newOpcode == Js::OpCode::ScopedLdMethodFld)
        {
            // Check whether we're loading (what appears to be) a built-in method.
            Js::BuiltinFunction builtInIndex = Js::BuiltinFunction::None;
            PropertySym *fieldSym = fieldSymOpnd->m_sym->AsPropertySym();
            this->CheckBuiltIn(fieldSym, &builtInIndex);
            regOpnd->m_sym->m_builtInIndex = builtInIndex;
        }
        break;

    case Js::OpCode::StFld:
        if (fieldSymOpnd->IsPropertySymOpnd())
        {
            fieldSymOpnd->AsPropertySymOpnd()->TryDisableRuntimePolymorphicCache();
        }
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
    case Js::OpCode::InitLetFld:
    case Js::OpCode::InitRootLetFld:
    case Js::OpCode::InitConstFld:
    case Js::OpCode::InitRootConstFld:
    case Js::OpCode::InitUndeclLetFld:
    case Js::OpCode::InitUndeclConstFld:
    case Js::OpCode::InitClassMember:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    {
        IR::Opnd *srcOpnd;
        // Store
        if (newOpcode == Js::OpCode::InitUndeclLetFld)
        {
            srcOpnd = IR::AddrOpnd::New(m_func->GetScriptContextInfo()->GetUndeclBlockVarAddr(), IR::AddrOpndKindDynamicVar, this->m_func, true);
            srcOpnd->SetValueType(ValueType::PrimitiveOrObject);
            newOpcode = Js::OpCode::InitLetFld;
        }
        else if (newOpcode == Js::OpCode::InitUndeclConstFld)
        {
            srcOpnd = IR::AddrOpnd::New(m_func->GetScriptContextInfo()->GetUndeclBlockVarAddr(), IR::AddrOpndKindDynamicVar, this->m_func, true);
            srcOpnd->SetValueType(ValueType::PrimitiveOrObject);
            newOpcode = Js::OpCode::InitConstFld;
        }
        else
        {
            srcOpnd = this->BuildSrcOpnd(regSlot);
        }

        if (isProfiled)
        {
            if (m_func->DoSimpleJitDynamicProfile())
            {
                instr = IR::JitProfilingInstr::New(newOpcode, fieldSymOpnd, srcOpnd, m_func);
            }
            else if (this->m_func->HasProfileInfo())
            {

                instr = IR::ProfiledInstr::New(newOpcode, fieldSymOpnd, srcOpnd, m_func);
                instr->AsProfiledInstr()->u.FldInfo() = *(m_func->GetReadOnlyProfileInfo()->GetFldInfo(inlineCacheIndex));
            }
        }

        // If it hasn't been set yet
        if (!instr)
        {
            instr = IR::Instr::New(newOpcode, fieldSymOpnd, srcOpnd, m_func);
        }
        break;
    }

    default:
        AssertMsg(UNREACHED, "Unknown ElementCP opcode");
        Fatal();
    }

    this->AddInstr(instr, offset);

    if(isLdFldThatWasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}